

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aistr.cpp
# Opt level: O3

void __thiscall Test_aistr_lengthConst_Test::TestBody(Test_aistr_lengthConst_Test *this)

{
  internal iVar1;
  bool bVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  AssertHelper local_20;
  internal local_18 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10;
  
  local_28.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_20.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_18,"ai::lengthConst(\"\")","0",(unsigned_long *)&local_28,(int *)&local_20);
  iVar1 = local_18[0];
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
               ,0x11,pcVar3);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (local_28.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_28.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_28.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (iVar1 != (internal)0x0) {
    local_28.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000005;
    local_20.data_._0_4_ = 5;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              (local_18,"ai::lengthConst(\"13245\")","5",(unsigned_long *)&local_28,(int *)&local_20
              );
    iVar1 = local_18[0];
    if (local_18[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_28);
      if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((local_10.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_20,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                 ,0x12,pcVar3);
      testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
      testing::internal::AssertHelper::~AssertHelper(&local_20);
      if (local_28.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (local_28.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_28.ptr_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (iVar1 != (internal)0x0) {
      local_28.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_0000000b;
      local_20.data_._0_4_ = 0xb;
      testing::internal::CmpHelperEQ<unsigned_long,int>
                (local_18,"ai::lengthConst(\"13245 dsfgs\")","11",(unsigned_long *)&local_28,
                 (int *)&local_20);
      if (local_18[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_28);
        if (local_10.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((local_10.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_20,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                   ,0x13,pcVar3);
        testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
        testing::internal::AssertHelper::~AssertHelper(&local_20);
        if (local_28.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             (local_28.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_28.ptr_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
  }
  return;
}

Assistant:

TEST_F(Test_aistr, lengthConst) {
    ASSERT_EQ(ai::lengthConst(""), 0);
    ASSERT_EQ(ai::lengthConst("13245"), 5);
    ASSERT_EQ(ai::lengthConst("13245 dsfgs"), 11);
    constexpr auto val4 = ai::lengthConst("13245 dsfgs");
    static_assert(val4 == 11, "");
}